

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::IfcElementAssembly(IfcElementAssembly *this)

{
  *(undefined ***)&this->field_0x190 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x198 = 0;
  *(char **)&this->field_0x1a0 = "IfcElementAssembly";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0075ada0);
  *(undefined8 *)&(this->super_IfcElement).field_0x140 = 0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x75ac98;
  *(undefined8 *)&this->field_0x190 = 0x75ad88;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x75acc0;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x75ace8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x75ad10;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x75ad38;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x75ad60;
  *(undefined1 **)&(this->super_IfcElement).field_0x148 = &this->field_0x158;
  *(undefined8 *)&this->field_0x150 = 0;
  this->field_0x158 = 0;
  this->field_0x168 = 0;
  (this->PredefinedType)._M_dataplus._M_p = (pointer)&(this->PredefinedType).field_2;
  (this->PredefinedType)._M_string_length = 0;
  (this->PredefinedType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}